

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_test.cc
# Opt level: O0

void intgemm::kernel_write_test<(intgemm::CPUType)4,signed_char>(void)

{
  char *pcVar1;
  char *__last;
  longlong (*palVar2) [8];
  size_t __n;
  undefined1 auVar3 [64];
  AssertionHandler catchAssertionHandler;
  size_t i;
  AlignedVector<signed_char> output;
  AlignedVector<signed_char> input;
  undefined1 auVar4 [24];
  undefined1 in_stack_fffffffffffffd80 [64];
  ExprLhs<const_signed_char_&> *in_stack_fffffffffffffdc0;
  SourceLineInfo local_130;
  StringRef local_120;
  ulong local_c8;
  undefined1 local_c0 [64];
  AlignedVector<signed_char> local_70;
  AlignedVector<signed_char> local_60 [5];
  
  auVar4 = in_stack_fffffffffffffd80._8_24_;
  if (3 < kCPU) {
    AlignedVector<signed_char>::AlignedVector
              (in_stack_fffffffffffffd80._24_8_,in_stack_fffffffffffffd80._16_8_,
               in_stack_fffffffffffffd80._8_8_);
    AlignedVector<signed_char>::AlignedVector(auVar4._16_8_,auVar4._8_8_,auVar4._0_8_);
    pcVar1 = AlignedVector<signed_char>::begin(local_60);
    __last = AlignedVector<signed_char>::end(local_60);
    std::iota<signed_char*,signed_char>(pcVar1,__last,'\0');
    palVar2 = AlignedVector<signed_char>::as<long_long__vector(8)>(local_60);
    auVar3 = vmovdqa64_avx512f((undefined1  [64])*palVar2);
    pcVar1 = AlignedVector<signed_char>::begin(&local_70);
    local_c0 = vmovdqa64_avx512f(auVar3);
    auVar3 = vmovdqa64_avx512f(local_c0);
    auVar3 = vmovdqa64_avx512f(auVar3);
    kernels::write((int)pcVar1,(void *)0x0,__n);
    for (local_c8 = 0; local_c8 < 0x40; local_c8 = local_c8 + 1) {
      local_120 = operator____catch_sr(auVar3._8_8_,auVar3._0_8_);
      Catch::SourceLineInfo::SourceLineInfo
                (&local_130,
                 "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/write_test.cc"
                 ,0x1c);
      Catch::StringRef::StringRef(auVar3._24_8_,auVar3._16_8_);
      Catch::AssertionHandler::AssertionHandler
                (auVar3._24_8_,auVar3._16_8_,auVar3._8_8_,auVar3._32_16_,auVar3._4_4_);
      AlignedVector<signed_char>::operator[](&local_70,local_c8);
      Catch::Decomposer::operator<=(auVar3._0_8_,(char *)0x28d14a);
      Catch::ExprLhs<signed_char_const&>::operator==(in_stack_fffffffffffffdc0,auVar3._56_8_);
      Catch::AssertionHandler::handleExpr(auVar3._8_8_,auVar3._0_8_);
      Catch::BinaryExpr<const_signed_char_&,_const_signed_char_&>::~BinaryExpr
                ((BinaryExpr<const_signed_char_&,_const_signed_char_&> *)0x28d1af);
      Catch::AssertionHandler::complete(auVar3._8_8_);
      Catch::AssertionHandler::~AssertionHandler(auVar3._8_8_);
    }
    AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x28d2ca);
    AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x28d2d7);
  }
  return;
}

Assistant:

void kernel_write_test() {
  if (kCPU < CPUType_)
    return;

  using vec_t = vector_t<CPUType_, ElemType_>;
  constexpr static std::size_t VECTOR_LENGTH = sizeof(vec_t) / sizeof(ElemType_);

  AlignedVector<ElemType_> input(VECTOR_LENGTH);
  AlignedVector<ElemType_> output(VECTOR_LENGTH);

  std::iota(input.begin(), input.end(), static_cast<ElemType_>(0));

  kernels::write(*input.template as<vec_t>(), output.begin(), 0);
  for (std::size_t i = 0; i < VECTOR_LENGTH; ++i)
#if !defined( __EXCEPTIONS) && defined(__GNUC__) && (__GNUC__ == 9) && ((__GNUC_MINOR__ == 3) || (__GNUC_MINOR__ == 4))
    CHECK(output[i] == input[i]); // GCC 9.3 - exceptions breaks std::iota with newer check.
#else
    CHECK(output[i] == ElemType_(i));
#endif
}